

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> __thiscall
wabt::MakeUnique<wabt::MemoryModuleField,wabt::Location>(wabt *this,Location *args)

{
  MemoryModuleField *this_00;
  
  this_00 = (MemoryModuleField *)operator_new(0x78);
  MemoryModuleField::MemoryModuleField(this_00,args,(string_view)ZEXT816(0));
  *(MemoryModuleField **)this = this_00;
  return (__uniq_ptr_data<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}